

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.h
# Opt level: O0

vector3 * vector3::aleatorioEmEsferaUnitaria(void)

{
  vector3 *in_RDI;
  double dVar1;
  vector3 *ponto;
  
  do {
    aleatorio(in_RDI,-1.0,1.0);
    dVar1 = quadradoComprimento(in_RDI);
  } while (1.0 <= dVar1);
  return in_RDI;
}

Assistant:

static const vector3 aleatorioEmEsferaUnitaria() {
        while(true) {
            vector3 ponto = vector3::aleatorio(-1, 1);
            if (ponto.quadradoComprimento() >= 1) continue;
            return ponto;
        }
    }